

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O2

uchar * rans_compress_O1(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint32_t freq;
  int iVar9;
  int iVar10;
  uchar *puVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  byte *pbVar15;
  long lVar16;
  uchar *puVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint32_t start;
  int iVar22;
  int *piVar23;
  long lVar24;
  long lVar25;
  int *piVar26;
  int *piVar27;
  uint uVar28;
  long lVar29;
  int (*__s) [256];
  byte *pbVar30;
  double dVar31;
  double dVar32;
  RansState rans3;
  RansState rans2;
  RansState rans1;
  RansState rans0;
  int T [256];
  int F [256] [256];
  RansEncSymbol syms [256] [256];
  
  if (in_size < 4) {
    puVar11 = rans_compress_O0(in,in_size,out_size);
    return puVar11;
  }
  dVar32 = (double)in_size * 1.05;
  dVar31 = dVar32 + 198147.0 + 9.0;
  uVar12 = (ulong)dVar31;
  puVar11 = (uchar *)malloc((long)(dVar31 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12);
  if (puVar11 == (uchar *)0x0) {
    puVar11 = (uchar *)0x0;
  }
  else {
    iVar9 = (int)dVar32;
    __s = F;
    memset(__s,0,0x40000);
    memset(T,0,0x400);
    uVar12 = 0;
    for (uVar20 = 0; in_size != uVar20; uVar20 = uVar20 + 1) {
      bVar1 = in[uVar20];
      T[uVar12] = T[uVar12] + 1;
      F[uVar12][bVar1] = F[uVar12][bVar1] + 1;
      uVar12 = (ulong)bVar1;
    }
    pbVar13 = puVar11 + 9;
    uVar12 = (ulong)(in_size >> 2);
    F[0][in[uVar12]] = F[0][in[uVar12]] + 1;
    F[0][in[uVar12 * 2]] = F[0][in[uVar12 * 2]] + 1;
    F[0][in[uVar12 * 3]] = F[0][in[uVar12 * 3]] + 1;
    piVar23 = T;
    T[0] = T[0] + 3;
    lVar24 = 1;
    piVar26 = F[0] + 1;
    uVar20 = 0;
    for (lVar25 = 0; piVar23 = piVar23 + 1, lVar25 != 0x100; lVar25 = lVar25 + 1) {
      iVar18 = T[lVar25];
      if (iVar18 != 0) {
        uVar19 = 0;
        iVar21 = 0;
        iVar10 = 0;
        for (uVar14 = 0; uVar14 != 0x100; uVar14 = uVar14 + 1) {
          iVar22 = (*__s)[uVar14];
          if (iVar22 != 0) {
            if (iVar21 < iVar22) {
              uVar19 = uVar14 & 0xffffffff;
            }
            if (iVar21 <= iVar22) {
              iVar21 = iVar22;
            }
            iVar22 = (int)((double)iVar22 * (4096.0 / (double)iVar18));
            iVar22 = iVar22 + (uint)(iVar22 == 0);
            (*__s)[uVar14] = iVar22;
            iVar10 = iVar10 + iVar22;
          }
        }
        F[lVar25][(int)uVar19] = (F[lVar25][(int)uVar19] - iVar10) + 0xfff;
        if ((int)uVar20 == 0) {
          *pbVar13 = (byte)lVar25;
          uVar20 = 0;
          pbVar30 = pbVar13 + 1;
          if ((lVar25 != 0) && (T[lVar25 + -1] != 0)) {
            for (uVar20 = 0; (lVar24 + uVar20 < 0x100 && (piVar23[uVar20] != 0));
                uVar20 = uVar20 + 1) {
            }
            pbVar13[1] = (byte)uVar20;
            pbVar30 = pbVar13 + 2;
          }
        }
        else {
          uVar20 = (ulong)((int)uVar20 - 1);
          pbVar30 = pbVar13;
        }
        iVar21 = -1;
        start = 0;
        iVar18 = 0;
        piVar27 = piVar26;
        for (lVar29 = 0; lVar29 != 0x100; lVar29 = lVar29 + 1) {
          if (F[lVar25][lVar29] != 0) {
            if (iVar18 == 0) {
              *pbVar30 = (byte)lVar29;
              pbVar13 = pbVar30 + 1;
              iVar18 = 0;
              if ((lVar29 != 0) && (iVar18 = 0, F[lVar25 + -1][lVar29 + 0xff] != 0)) {
                for (lVar16 = 0; lVar29 + lVar16 != 0xff; lVar16 = lVar16 + 1) {
                  if (piVar27[lVar16] == 0) {
                    iVar18 = (int)lVar16 - iVar21;
                    goto LAB_0012e3bb;
                  }
                }
                iVar18 = 0x100;
LAB_0012e3bb:
                iVar18 = ~(uint)lVar29 + iVar18;
                pbVar30[1] = (byte)iVar18;
                pbVar13 = pbVar30 + 2;
              }
            }
            else {
              iVar18 = iVar18 + -1;
              pbVar13 = pbVar30;
            }
            iVar10 = F[lVar25][lVar29];
            if (iVar10 < 0x80) {
              lVar16 = 1;
              pbVar15 = pbVar13;
            }
            else {
              pbVar15 = pbVar13 + 1;
              *pbVar13 = (byte)((uint)iVar10 >> 8) | 0x80;
              iVar10 = F[lVar25][lVar29];
              lVar16 = 2;
            }
            pbVar30 = pbVar13 + lVar16;
            *pbVar15 = (byte)iVar10;
            freq = F[lVar25][lVar29];
            RansEncSymbolInit(syms[lVar25] + lVar29,start,freq,(uint32_t)pbVar15);
            start = start + freq;
          }
          iVar21 = iVar21 + -1;
          piVar27 = piVar27 + 1;
        }
        *pbVar30 = 0;
        pbVar13 = pbVar30 + 1;
      }
      lVar24 = lVar24 + 1;
      __s = __s + 1;
      piVar26 = piVar26 + 0x100;
    }
    *pbVar13 = 0;
    pbVar13 = pbVar13 + (1 - (long)puVar11);
    if (0x30602 < (uint)pbVar13) {
      __assert_fail("tab_size < 257*257*3",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                    ,0x1dd,
                    "unsigned char *rans_compress_O1(unsigned char *, unsigned int, unsigned int *)"
                   );
    }
    rans0 = 0x800000;
    rans1 = 0x800000;
    rans2 = 0x800000;
    rans3 = 0x800000;
    bVar1 = in[uVar12 - 1];
    bVar2 = in[uVar12 * 2 + -1];
    iVar18 = (int)(uVar12 * 3);
    bVar3 = in[(long)iVar18 + -1];
    uVar28 = in_size - 2;
    lVar24 = (long)(int)uVar28;
    bVar4 = in[in_size - 1];
    for (; (int)((in_size & 0xfffffffc) - 2) < (int)uVar28; uVar28 = uVar28 - 1) {
      bVar5 = in[uVar28];
      RansEncPutSymbol(&rans3,(uint8_t **)&stack0xffffffffffebfb98,syms[bVar5] + bVar4);
      lVar24 = lVar24 + -1;
      bVar4 = bVar5;
    }
    puVar17 = in;
    for (uVar28 = (in_size >> 2) - 2; -1 < (int)uVar28; uVar28 = uVar28 - 1) {
      bVar5 = puVar17[lVar24];
      bVar6 = puVar17[iVar18 + -2];
      bVar7 = puVar17[(ulong)(in_size >> 1 & 0x7ffffffe) - 2];
      bVar8 = in[uVar28];
      RansEncPutSymbol(&rans3,(uint8_t **)&stack0xffffffffffebfb98,syms[bVar5] + bVar4);
      RansEncPutSymbol(&rans2,(uint8_t **)&stack0xffffffffffebfb98,syms[bVar6] + bVar3);
      RansEncPutSymbol(&rans1,(uint8_t **)&stack0xffffffffffebfb98,syms[bVar7] + bVar2);
      RansEncPutSymbol(&rans0,(uint8_t **)&stack0xffffffffffebfb98,syms[bVar8] + bVar1);
      puVar17 = puVar17 + -1;
      bVar1 = bVar8;
      bVar4 = bVar5;
      bVar2 = bVar7;
      bVar3 = bVar6;
    }
    RansEncPutSymbol(&rans3,(uint8_t **)&stack0xffffffffffebfb98,syms[0] + bVar4);
    RansEncPutSymbol(&rans2,(uint8_t **)&stack0xffffffffffebfb98,syms[0] + bVar3);
    RansEncPutSymbol(&rans1,(uint8_t **)&stack0xffffffffffebfb98,syms[0] + bVar2);
    RansEncPutSymbol(&rans0,(uint8_t **)&stack0xffffffffffebfb98,syms[0] + bVar1);
    *(RansState *)(puVar11 + (long)iVar9 + 0x30608) = rans3;
    *(RansState *)(puVar11 + (long)iVar9 + 0x30604) = rans2;
    *(RansState *)(puVar11 + (long)iVar9 + 0x30600) = rans1;
    *(RansState *)(puVar11 + (long)iVar9 + 0x305fc) = rans0;
    puVar17 = puVar11 + (((long)iVar9 + 0x3060c) - (long)(puVar11 + (long)iVar9 + 0x305fc));
    uVar28 = (uint)(pbVar13 + (long)puVar17);
    *out_size = uVar28;
    *puVar11 = '\x01';
    puVar11[1] = (char)(pbVar13 + (long)puVar17) + 0xf7;
    puVar11[2] = (uchar)(uVar28 + 0xfff7 >> 8);
    puVar11[3] = (uchar)(uVar28 + 0xfffff7 >> 0x10);
    puVar11[4] = (uchar)(uVar28 - 9 >> 0x18);
    puVar11[5] = (uchar)in_size;
    puVar11[6] = (uchar)(in_size >> 8);
    puVar11[7] = (uchar)(in_size >> 0x10);
    puVar11[8] = (uchar)(in_size >> 0x18);
    memmove(puVar11 + ((uint)pbVar13 & 0x3ffff),puVar11 + (long)iVar9 + 0x305fc,(size_t)puVar17);
  }
  return puVar11;
}

Assistant:

unsigned char *rans_compress_O1(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf, *out_end, *cp;
    unsigned int last_i, tab_size, rle_i, rle_j;
    RansEncSymbol syms[256][256];

    if (in_size < 4)
	return rans_compress_O0(in, in_size, out_size);

    out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    if (!out_buf)
	return NULL;

    out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;
    cp = out_buf+9;

    int F[256][256], T[256], i, j;
    unsigned char c;

    memset(F, 0, 256*256*sizeof(int));
    memset(T, 0, 256*sizeof(int));
    //for (last = 0, i=in_size-1; i>=0; i--) {
    //	F[last][c = in[i]]++;
    //	T[last]++;
    //	last = c;
    //}

    for (last_i=i=0; i<in_size; i++) {
	F[last_i][c = in[i]]++;
	T[last_i]++;
	last_i = c;
    }
    F[0][in[1*(in_size>>2)]]++;
    F[0][in[2*(in_size>>2)]]++;
    F[0][in[3*(in_size>>2)]]++;
    T[0]+=3;

    // Normalise so T[i] == TOTFREQ
    for (rle_i = i = 0; i < 256; i++) {
	int t2, m, M;
	unsigned int x;

	if (T[i] == 0)
	    continue;

	//uint64_t p = (TOTFREQ * TOTFREQ) / t;
	double p = ((double)TOTFREQ)/T[i];
	for (t2 = m = M = j = 0; j < 256; j++) {
	    if (!F[i][j])
		continue;

	    if (m < F[i][j])
		m = F[i][j], M = j;

	    //if ((F[i][j] = (F[i][j] * p) / TOTFREQ) == 0)
	    if ((F[i][j] *= p) == 0)
		F[i][j] = 1;
	    t2 += F[i][j];
	}

	t2++;
	if (t2 < TOTFREQ)
	    F[i][M] += TOTFREQ-t2;
	else
	    F[i][M] -= t2-TOTFREQ;

	// Store frequency table
	// i
	if (rle_i) {
	    rle_i--;
	} else {
	    *cp++ = i;
	    // FIXME: could use order-0 statistics to observe which alphabet
	    // symbols are present and base RLE on that ordering instead.
	    if (i && T[i-1]) {
		for(rle_i=i+1; rle_i<256 && T[rle_i]; rle_i++)
		    ;
		rle_i -= i+1;
		*cp++ = rle_i;
	    }
	}

	int *F_i_ = F[i];
	x = 0;
	rle_j = 0;
	for (j = 0; j < 256; j++) {
	    if (F_i_[j]) {
		//fprintf(stderr, "F[%d][%d]=%d, x=%d\n", i, j, F_i_[j], x);

		// j
		if (rle_j) {
		    rle_j--;
		} else {
		    *cp++ = j;
		    if (!rle_j && j && F_i_[j-1]) {
			for(rle_j=j+1; rle_j<256 && F_i_[rle_j]; rle_j++)
			    ;
			rle_j -= j+1;
			*cp++ = rle_j;
		    }
		}

		// F_i_[j]
		if (F_i_[j]<128) {
		    *cp++ = F_i_[j];
		} else {
		    *cp++ = 128 | (F_i_[j]>>8);
		    *cp++ = F_i_[j]&0xff;
		}

		RansEncSymbolInit(&syms[i][j], x, F_i_[j], TF_SHIFT);
		x += F_i_[j];
	    }
	}
	*cp++ = 0;
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp - out_buf;
    assert(tab_size < 257*257*3);

    RansState rans0, rans1, rans2, rans3;
    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    uint8_t* ptr = out_end;

    int isz4 = in_size>>2;
    int i0 = 1*isz4-2;
    int i1 = 2*isz4-2;
    int i2 = 3*isz4-2;
    int i3 = 4*isz4-2;

    unsigned char l0 = in[i0+1];
    unsigned char l1 = in[i1+1];
    unsigned char l2 = in[i2+1];
    unsigned char l3 = in[i3+1];

    // Deal with the remainder
    l3 = in[in_size-1];
    for (i3 = in_size-2; i3 > 4*isz4-2; i3--) {
	unsigned char c3 = in[i3];
	RansEncPutSymbol(&rans3, &ptr, &syms[c3][l3]);
	l3 = c3;
    }

    for (; i0 >= 0; i0--, i1--, i2--, i3--) {
	unsigned char c0, c1, c2, c3;
	RansEncSymbol *s3 = &syms[c3 = in[i3]][l3];
	RansEncSymbol *s2 = &syms[c2 = in[i2]][l2];
	RansEncSymbol *s1 = &syms[c1 = in[i1]][l1];
	RansEncSymbol *s0 = &syms[c0 = in[i0]][l0];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);

	l0 = c0;
	l1 = c1;
	l2 = c2;
	l3 = c3;
    }

    RansEncPutSymbol(&rans3, &ptr, &syms[0][l3]);
    RansEncPutSymbol(&rans2, &ptr, &syms[0][l2]);
    RansEncPutSymbol(&rans1, &ptr, &syms[0][l1]);
    RansEncPutSymbol(&rans0, &ptr, &syms[0][l0]);

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;
    *cp++ = 1; // order

    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}